

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O2

void __thiscall QFactoryLoader::setExtraSearchPath(QFactoryLoader *this,QString *path)

{
  QString *s1;
  vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
  *this_00;
  QLibraryPrivate *pQVar1;
  long lVar2;
  QObject *pQVar3;
  bool bVar4;
  Type *mutex;
  reference pvVar5;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
  *this_01;
  qsizetype i;
  ulong __n;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  s1 = &(this->d).extraSearchPath;
  this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
             *)s1;
  bVar4 = ::comparesEqual(s1,path);
  if (!bVar4) {
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
            ::operator->(this_01);
    QMutexLocker<QRecursiveMutex>::QMutexLocker
              ((QMutexLocker<QRecursiveMutex> *)local_38,&mutex->mutex);
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    std::__exchange<QString,QString_const&>((QString *)&local_58,s1,path);
    if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
      Private::updateSinglePath(&this->d,s1);
    }
    else {
      this_00 = &(this->d).libraries;
      for (__n = 0; __n < (ulong)(this->d).loadedLibraries.d.size; __n = __n + 1) {
        if ((this->d).loadedLibraries.d.ptr[__n] == true) {
          pvVar5 = std::
                   vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                   ::at(this_00,__n);
          pQVar1 = (pvVar5->_M_t).super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
                   super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl;
          lVar2 = (long)(pQVar1->inst).wp.d;
          if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) &&
             (pQVar3 = (pQVar1->inst).wp.value, pQVar3 != (QObject *)0x0)) {
            (*pQVar3->_vptr_QObject[4])();
          }
        }
      }
      QList<bool>::fill(&(this->d).loadedLibraries,false,-1);
      QDuplicateTracker<QString,_32UL>::clear(&(this->d).loadedPaths);
      std::
      vector<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
      ::clear(this_00);
      std::
      _Rb_tree<QString,_std::pair<const_QString,_QLibraryPrivate_*>,_std::_Select1st<std::pair<const_QString,_QLibraryPrivate_*>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
      ::clear(&(this->d).keyMap._M_t);
      update(this);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFactoryLoader::setExtraSearchPath(const QString &path)
{
#if QT_CONFIG(library)
    if (d->extraSearchPath == path)
        return;             // nothing to do

    QMutexLocker locker(&qt_factoryloader_global->mutex);
    QString oldPath = std::exchange(d->extraSearchPath, path);
    if (oldPath.isEmpty()) {
        // easy case, just update this directory
        d->updateSinglePath(d->extraSearchPath);
    } else {
        // must re-scan everything
        for (qsizetype i = 0; i < d->loadedLibraries.size(); ++i) {
            if (d->loadedLibraries.at(i)) {
                auto &plugin = d->libraries.at(i);
                delete plugin->inst.data();
            }
        }
        d->loadedLibraries.fill(false);
        d->loadedPaths.clear();
        d->libraries.clear();
        d->keyMap.clear();
        update();
    }
#else
    Q_UNUSED(path);
#endif
}